

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sgen4.c
# Opt level: O2

void setAnnealingPermute(void)

{
  int *piVar1;
  int *piVar2;
  int iVar3;
  long lVar4;
  uint p1;
  uint p2;
  ulong uVar5;
  int iVar6;
  double dVar7;
  double dVar8;
  
  uperm2 = unpermute;
  perm2 = permute;
  for (lVar4 = 1; uVar5 = (ulong)numOfVariables, lVar4 <= (long)uVar5; lVar4 = lVar4 + 1) {
    perm2[lVar4] = (int)lVar4;
    uperm2[lVar4] = (int)lVar4;
  }
  uperm1 = idpermute;
  perm1 = idpermute;
  for (dVar7 = 20.0; 0.2 < dVar7; dVar7 = dVar7 * 0.997) {
    for (iVar6 = 1; iVar3 = (int)uVar5,
        iVar6 == iVar3 * 4 || SBORROW4(iVar6,iVar3 * 4) != iVar6 + iVar3 * -4 < 0; iVar6 = iVar6 + 1
        ) {
      lVar4 = next * 0x41c64e6d + 0x3039;
      next = lVar4 * 0x41c64e6d + 0x3039;
      p1 = (int)((long)(ulong)((uint)((ulong)lVar4 >> 0x10) & 0x7fff) % (long)iVar3) + 1;
      p2 = (int)((long)(ulong)((uint)(next >> 0x10) & 0x7fff) % (long)iVar3) + 1;
      dVar8 = swapGain(p1,p2);
      iVar3 = beatProbability(dVar8 / dVar7);
      piVar1 = permute;
      if (iVar3 != 0) {
        iVar3 = permute[p1];
        permute[p1] = permute[p2];
        piVar1[p2] = iVar3;
        piVar2 = unpermute;
        unpermute[piVar1[p1]] = p1;
        piVar2[piVar1[p2]] = p2;
      }
      uVar5 = (ulong)(uint)numOfVariables;
    }
  }
  return;
}

Assistant:

void setAnnealingPermute ()
{
    int i, p1, p2, t;
    double temperature;
    double gain;

    for (i=1;i<=numOfVariables;i++)
    {
        permute[i] = i;
        unpermute[i] = i;
    }
    uperm1 = idpermute;
    perm1 = idpermute;
    perm2 = permute;
    uperm2 = unpermute;

    temperature = 20;

    while (temperature > 0.2)
    {
        for (i=1;i<=4*numOfVariables;i++)
        {
            p1 = 1 + myrand() % numOfVariables;
            p2 = 1 + myrand() % numOfVariables;
            gain = swapGain (p1, p2);
            if (beatProbability (gain/temperature))
            {
                t = permute[p1];
                permute[p1] = permute[p2];
                permute[p2] = t;
                unpermute[permute[p1]] = p1;
                unpermute[permute[p2]] = p2;

            }
       }
        temperature *= 0.997;
     }

}